

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O3

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRange>>
::
ForEachActive<mp::Convert1<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRange>,mp::Convert1ExpC>>
          (ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRange>>
           *this,Convert1<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>,_mp::Convert1ExpC>
                 fn)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ConType *con;
  long lVar7;
  long lVar8;
  int i;
  long lVar9;
  Convert1<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>,_mp::Convert1ExpC>
  local_30;
  
  lVar8 = 0;
  lVar9 = 0;
  local_30.
  super_Convert1ExpC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  .
  super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  .mc_ = fn.
         super_Convert1ExpC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
         .
         super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
         .mc_;
  do {
    lVar3 = *(long *)(this + 0xf8);
    lVar1 = *(long *)(this + 0xe0);
    if ((int)((int)((ulong)(*(long *)(this + 0xf0) - lVar1) >> 3) * -0x1642c859 +
             (int)((ulong)(*(long *)(this + 0x100) - *(long *)(this + 0x108)) >> 3) * -0x1642c859 +
             ((int)((ulong)(*(long *)(this + 0x118) - lVar3) >> 3) + -1 +
             (uint)(*(long *)(this + 0x118) == 0)) * 2) <= lVar9) {
      return;
    }
    uVar4 = (lVar1 - *(long *)(this + 0xe8) >> 3) * -0x2c8590b21642c859 + lVar9;
    uVar5 = (long)uVar4 >> 1;
    uVar6 = uVar5;
    if ((long)uVar4 < 0) {
LAB_004278f0:
      lVar7 = (uVar4 + uVar6 * -2) * 0xb8 + *(long *)(lVar3 + uVar6 * 8);
    }
    else {
      if (1 < uVar4) {
        uVar6 = uVar4 >> 1;
        goto LAB_004278f0;
      }
      lVar7 = lVar1 + lVar8;
    }
    if ((*(char *)(lVar7 + 0xb0) == '\0') && (*(char *)(lVar7 + 0xb1) == '\0')) {
      if ((long)uVar4 < 0) {
LAB_0042793c:
        con = (ConType *)((uVar4 + uVar5 * -2) * 0xb8 + *(long *)(lVar3 + uVar5 * 8));
      }
      else {
        if (1 < uVar4) {
          uVar5 = uVar4 >> 1;
          goto LAB_0042793c;
        }
        con = (ConType *)(lVar1 + lVar8);
      }
      bVar2 = Convert1<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>,_mp::Convert1ExpC>
              ::operator()(&local_30,con,(int)lVar9);
      if (bVar2) {
        uVar6 = (*(long *)(this + 0xe0) - *(long *)(this + 0xe8) >> 3) * -0x2c8590b21642c859 + lVar9
        ;
        if ((long)uVar6 < 0) {
          uVar4 = (long)uVar6 >> 1;
LAB_0042799a:
          lVar3 = (uVar6 + uVar4 * -2) * 0xb8 + *(long *)(*(long *)(this + 0xf8) + uVar4 * 8);
        }
        else {
          if (1 < uVar6) {
            uVar4 = uVar6 >> 1;
            goto LAB_0042799a;
          }
          lVar3 = *(long *)(this + 0xe0) + lVar8;
        }
        if (*(char *)(lVar3 + 0xb0) == '\0') {
          *(undefined1 *)(lVar3 + 0xb0) = 1;
          *(int *)(this + 0x124) = *(int *)(this + 0x124) + 1;
        }
      }
    }
    lVar9 = lVar9 + 1;
    lVar8 = lVar8 + 0xb8;
  } while( true );
}

Assistant:

void ForEachActive(Fn fn) {
		for (int i=0; i<(int)cons_.size(); ++i)
      if (!cons_[i].IsRedundant())
        if (fn(cons_[i].GetCon(), i))
          MarkAsBridged(cons_[i], i);
	}